

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_FloatToString.h
# Opt level: O3

char * choc::text::FloatToStringBuffer<float>::writeAndGetEnd
                 (char *pos,float value,int maxDecimalPlaces)

{
  long lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  float fVar9;
  uint uVar10;
  uint32_t totalLength;
  long lVar11;
  char *pcVar12;
  int maxDecimalPlaces_00;
  ulong uVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  MantissaAndExponent value_00;
  MantissaAndExponent upperBound;
  int K;
  Limits limits;
  int *in_stack_ffffffffffffffa8;
  int local_4c;
  Limits local_48;
  
  if ((int)value < 0) {
    *pos = '-';
    fVar9 = ABS(value);
    value = ABS(value);
    if (fVar9 == 0.0) {
      pos[1] = '0';
      pos[2] = '.';
      pos[3] = '0';
      return pos + 4;
    }
    pos = pos + 1;
  }
  else if (value == 0.0) {
    pos[0] = '0';
    pos[1] = '.';
    pos[2] = '0';
    goto LAB_001cb6c6;
  }
  if (value == INFINITY) {
    ((FloatToStringBuffer<float> *)pos)->storage[0] = 'i';
    ((FloatToStringBuffer<float> *)pos)->storage[1] = 'n';
    ((FloatToStringBuffer<float> *)pos)->storage[2] = 'f';
  }
  else {
    if (value != NAN) {
      uVar10 = (uint)value >> 0x17 & 0xff;
      uVar16 = (ulong)((uint)value & 0x7fffff) + 0x800000;
      if (uVar10 == 0) {
        uVar16 = (ulong)((uint)value & 0x7fffff);
      }
      uVar13 = 0xffffff6b;
      if (uVar10 != 0) {
        uVar13 = (ulong)(uVar10 - 0x96);
      }
      value_00._8_8_ = uVar13;
      value_00.mantissa = uVar16;
      Limits::Limits(&local_48,value_00);
      dVar8 = (double)(local_48.upper.exponent + 0x3d) * -0.30102999566398114;
      uVar10 = (int)dVar8 + (uint)((double)(int)dVar8 < dVar8) + 0x15b;
      lVar15 = (long)((int)uVar10 >> 3) * 0x10;
      local_4c = 0x154 - (uVar10 & 0xfffffff8);
      uVar13 = *(ulong *)(createPowerOf10(int,int&)::powerOf10List + lVar15 + 0x10);
      lVar1 = 0x3f;
      if (uVar16 != 0) {
        for (; uVar16 >> lVar1 == 0; lVar1 = lVar1 + -1) {
        }
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar13;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar16 << (~(byte)lVar1 & 0x3f);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar13;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_48.upper.mantissa;
      lVar14 = SUB168(auVar3 * auVar6,8);
      lVar11 = -(SUB168(auVar3 * auVar6,0) >> 0x3f);
      lVar1 = lVar14 + lVar11;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar13;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_48.lower.mantissa;
      upperBound._8_8_ =
           ((SUB168(auVar2 * auVar5,0) >> 0x3f) - SUB168(auVar2 * auVar5,8)) + lVar1 + -1;
      upperBound.mantissa =
           (ulong)(local_48.upper.exponent +
                   *(int *)(createPowerOf10(int,int&)::powerOf10List + lVar15 + 0x18) + 0x40);
      totalLength = generateDigits((FloatToStringBuffer<float> *)pos,(char *)(lVar14 + lVar11 + -1),
                                   upperBound,
                                   (~(SUB168(auVar4 * auVar7,8) -
                                     (SUB168(auVar4 * auVar7,0) >> 0x3f)) - 1U) + lVar1,
                                   (uint64_t)&local_4c,in_stack_ffffffffffffffa8);
      maxDecimalPlaces_00 = 0x144;
      if (-1 < maxDecimalPlaces) {
        maxDecimalPlaces_00 = maxDecimalPlaces;
      }
      pcVar12 = addDecimalPointAndExponent(pos,totalLength,local_4c,maxDecimalPlaces_00);
      return pcVar12;
    }
    ((FloatToStringBuffer<float> *)pos)->storage[0] = 'n';
    ((FloatToStringBuffer<float> *)pos)->storage[1] = 'a';
    ((FloatToStringBuffer<float> *)pos)->storage[2] = 'n';
  }
LAB_001cb6c6:
  return ((FloatToStringBuffer<float> *)pos)->storage + 3;
}

Assistant:

static const char* writeAndGetEnd (char* pos, FloatOrDouble value, int maxDecimalPlaces)
    {
        auto floatBits = getFloatBits (value);

        if ((floatBits & signMask) == 0)
        {
            if (isZero (floatBits))  return writeZero (pos);
        }
        else
        {
            pos = write (pos, '-');

            if (isZero (floatBits))  return writeZero (pos);

            value = -value;
            floatBits &= ~signMask;
        }

        if (floatBits == nanBits)  return write (pos, 'n', 'a', 'n');
        if (floatBits == infBits)  return write (pos, 'i', 'n', 'f');

        auto v = MantissaAndExponent::create (floatBits, floatBits & significandMask);
        Limits limits (v);

        int K;
        auto powerOf10 = createPowerOf10 (limits.upper.exponent, K);
        auto w = powerOf10 * v.normalized();
        auto upperBound = powerOf10 * limits.upper;
        upperBound.mantissa--;
        auto lowerBound = powerOf10 * limits.lower;
        lowerBound.mantissa++;

        auto totalLength = generateDigits (pos, upperBound, upperBound.mantissa - w.mantissa, upperBound.mantissa - lowerBound.mantissa, K);
        return addDecimalPointAndExponent (pos, totalLength, K, maxDecimalPlaces < 0 ? defaultNumDecimalPlaces : maxDecimalPlaces);
    }